

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

void writeentry(int fd,toptenentry *tt)

{
  uint uVar1;
  uint uVar2;
  boolean bVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char buf [1024];
  
  snprintf(buf,0x400,"%d.%d.%d %d %d %d %d %d %d %d %d %d %d ",(ulong)(uint)tt->ver_major,
           (ulong)(uint)tt->ver_minor,(ulong)(uint)tt->patchlevel,(ulong)(uint)tt->points,
           (ulong)(uint)tt->deathdnum,(ulong)(uint)tt->deathlev,(ulong)(uint)tt->maxlvl,
           (ulong)(uint)tt->hp,(ulong)(uint)tt->maxhp,(ulong)(uint)tt->deaths,
           (ulong)(uint)tt->deathdate,(ulong)(uint)tt->birthdate,(ulong)(uint)tt->uid);
  sVar4 = strlen(buf);
  sVar5 = write(fd,buf,(long)(int)sVar4);
  if (sVar5 != (long)(int)sVar4) {
    panic("Failed to write topten. Out of disk?");
  }
  uVar1 = tt->moves;
  uVar2 = tt->how;
  bVar3 = onlyspace(tt->name);
  pcVar6 = "_";
  if (bVar3 == '\0') {
    pcVar6 = tt->name;
  }
  snprintf(buf,0x400,"%d %d %s %s %s %s %s,%s\n",(ulong)uVar1,(ulong)uVar2,tt->plrole,tt->plrace,
           tt->plgend,tt->plalign,pcVar6,tt->death);
  sVar4 = strlen(buf);
  sVar5 = write(fd,buf,(long)(int)sVar4);
  if (sVar5 == (long)(int)sVar4) {
    return;
  }
  panic("Failed to write topten. Out of disk?");
}

Assistant:

static void writeentry(int fd, const struct toptenentry *tt)
{
    char buf[1024];
    int len;
    
    snprintf(buf, 1024, "%d.%d.%d %d %d %d %d %d %d %d %d %d %d ",
	     tt->ver_major, tt->ver_minor, tt->patchlevel,
	     tt->points, tt->deathdnum, tt->deathlev,
	     tt->maxlvl, tt->hp, tt->maxhp, tt->deaths,
	     tt->deathdate, tt->birthdate, tt->uid);
    len = strlen(buf);
    if (write(fd, buf, len) != len) panic("Failed to write topten. Out of disk?");
    
    snprintf(buf, 1024, "%d %d %s %s %s %s %s,%s\n",
	    tt->moves, tt->how, tt->plrole, tt->plrace, tt->plgend, tt->plalign,
	    onlyspace(tt->name) ? "_" : tt->name, tt->death);
    len = strlen(buf);
    if (write(fd, buf, len) != len) panic("Failed to write topten. Out of disk?");
}